

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

Flow * __thiscall
wasm::Visitor<wasm::ModuleRunner,_wasm::Flow>::visit
          (Flow *__return_storage_ptr__,Visitor<wasm::ModuleRunner,_wasm::Flow> *this,
          Expression *curr)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_18;
  __node_gen_type __node_gen;
  
  uVar4 = PRINT._4_4_;
  uVar3 = (undefined4)PRINT;
  uVar2 = NONCONSTANT_FLOW._4_4_;
  uVar1 = (undefined4)NONCONSTANT_FLOW;
  if (curr == (Expression *)0x0) {
    __assert_fail("curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x3b,
                  "ReturnType wasm::Visitor<wasm::ModuleRunner, wasm::Flow>::visit(Expression *) [SubType = wasm::ModuleRunner, ReturnType = wasm::Flow]"
                 );
  }
  switch(curr->_id) {
  case BlockId:
    ExpressionRunner<wasm::ModuleRunner>::visitBlock
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(Block *)curr);
    break;
  case IfId:
    ExpressionRunner<wasm::ModuleRunner>::visitIf
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(If *)curr);
    break;
  case LoopId:
    ExpressionRunner<wasm::ModuleRunner>::visitLoop
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(Loop *)curr);
    break;
  case BreakId:
    ExpressionRunner<wasm::ModuleRunner>::visitBreak
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(Break *)curr);
    break;
  case SwitchId:
    ExpressionRunner<wasm::ModuleRunner>::visitSwitch
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(Switch *)curr);
    break;
  case CallId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitCall
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(Call *)curr);
    break;
  case CallIndirectId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitCallIndirect
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,
               (CallIndirect *)curr);
    break;
  case LocalGetId:
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,
               (SmallVector<wasm::Literal,_1UL> *)
               ((ulong)*(uint *)(curr + 1) * 0x38 + **(long **)(this + 0x138)));
    uVar1 = 0;
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    goto LAB_00129b4e;
  case LocalSetId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitLocalSet
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(LocalSet *)curr)
    ;
    break;
  case GlobalGetId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitGlobalGet
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(GlobalGet *)curr
              );
    break;
  case GlobalSetId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitGlobalSet
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(GlobalSet *)curr
              );
    break;
  case LoadId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitLoad
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(Load *)curr);
    break;
  case StoreId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitStore
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(Store *)curr);
    break;
  case ConstId:
    ExpressionRunner<wasm::ModuleRunner>::visitConst
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(Const *)curr);
    break;
  case UnaryId:
    ExpressionRunner<wasm::ModuleRunner>::visitUnary
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(Unary *)curr);
    break;
  case BinaryId:
    ExpressionRunner<wasm::ModuleRunner>::visitBinary
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(Binary *)curr);
    break;
  case SelectId:
    ExpressionRunner<wasm::ModuleRunner>::visitSelect
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(Select *)curr);
    break;
  case DropId:
    ExpressionRunner<wasm::ModuleRunner>::visitDrop
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(Drop *)curr);
    break;
  case ReturnId:
    ExpressionRunner<wasm::ModuleRunner>::visitReturn
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(Return *)curr);
    break;
  case MemorySizeId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitMemorySize
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,
               (MemorySize *)curr);
    break;
  case MemoryGrowId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryGrow
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,
               (MemoryGrow *)curr);
    break;
  case UnreachableId:
    (**(code **)(*(long *)this + 0x10))(this,"unreachable");
    wasm::handle_unreachable
              ("unreachable",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
               ,0x57a);
  case AtomicRMWId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitAtomicRMW
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(AtomicRMW *)curr
              );
    break;
  case AtomicCmpxchgId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitAtomicCmpxchg
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,
               (AtomicCmpxchg *)curr);
    break;
  case AtomicWaitId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitAtomicWait
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,
               (AtomicWait *)curr);
    break;
  case AtomicNotifyId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitAtomicNotify
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,
               (AtomicNotify *)curr);
    break;
  case SIMDExtractId:
    ExpressionRunner<wasm::ModuleRunner>::visitSIMDExtract
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,
               (SIMDExtract *)curr);
    break;
  case SIMDReplaceId:
    ExpressionRunner<wasm::ModuleRunner>::visitSIMDReplace
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,
               (SIMDReplace *)curr);
    break;
  case SIMDShuffleId:
    ExpressionRunner<wasm::ModuleRunner>::visitSIMDShuffle
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,
               (SIMDShuffle *)curr);
    break;
  case SIMDTernaryId:
    ExpressionRunner<wasm::ModuleRunner>::visitSIMDTernary
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,
               (SIMDTernary *)curr);
    break;
  case SIMDShiftId:
    ExpressionRunner<wasm::ModuleRunner>::visitSIMDShift
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(SIMDShift *)curr
              );
    break;
  case SIMDLoadId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoad
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(SIMDLoad *)curr)
    ;
    break;
  case SIMDLoadStoreLaneId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoadStoreLane
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,
               (SIMDLoadStoreLane *)curr);
    break;
  case MemoryInitId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryInit
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,
               (MemoryInit *)curr);
    break;
  case DataDropId:
    local_18 = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)(this + 0x90);
    std::
    _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
              (local_18,curr + 1,&local_18);
  case NopId:
  case AtomicFenceId:
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                      _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
    break;
  case MemoryCopyId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryCopy
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,
               (MemoryCopy *)curr);
    break;
  case MemoryFillId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryFill
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,
               (MemoryFill *)curr);
    break;
  case PopId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitPop
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(Pop *)curr);
    break;
  case RefNullId:
    ExpressionRunner<wasm::ModuleRunner>::visitRefNull
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(RefNull *)curr);
    break;
  case RefIsNullId:
    ExpressionRunner<wasm::ModuleRunner>::visitRefIsNull
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(RefIsNull *)curr
              );
    break;
  case RefFuncId:
    ExpressionRunner<wasm::ModuleRunner>::visitRefFunc
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(RefFunc *)curr);
    break;
  case RefEqId:
    ExpressionRunner<wasm::ModuleRunner>::visitRefEq
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(RefEq *)curr);
    break;
  case TableGetId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitTableGet
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(TableGet *)curr)
    ;
    break;
  case TableSetId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitTableSet
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(TableSet *)curr)
    ;
    break;
  case TableSizeId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitTableSize
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(TableSize *)curr
              );
    break;
  case TableGrowId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitTableGrow
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(TableGrow *)curr
              );
    break;
  case TableFillId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitTableFill
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(TableFill *)curr
              );
    break;
  case TableCopyId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitTableCopy
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(TableCopy *)curr
              );
    break;
  case TableInitId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitTableInit
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(TableInit *)curr
              );
    break;
  case TryId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitTry
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(Try *)curr);
    break;
  case TryTableId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitTryTable
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(TryTable *)curr)
    ;
    break;
  case ThrowId:
    ExpressionRunner<wasm::ModuleRunner>::visitThrow
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(Throw *)curr);
    break;
  case RethrowId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitRethrow
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(Rethrow *)curr);
    break;
  case ThrowRefId:
    ExpressionRunner<wasm::ModuleRunner>::visitThrowRef
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(ThrowRef *)curr)
    ;
    break;
  case TupleMakeId:
    ExpressionRunner<wasm::ModuleRunner>::visitTupleMake
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(TupleMake *)curr
              );
    break;
  case TupleExtractId:
    ExpressionRunner<wasm::ModuleRunner>::visitTupleExtract
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,
               (TupleExtract *)curr);
    break;
  case RefI31Id:
    ExpressionRunner<wasm::ModuleRunner>::visitRefI31
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(RefI31 *)curr);
    break;
  case I31GetId:
    ExpressionRunner<wasm::ModuleRunner>::visitI31Get
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(I31Get *)curr);
    break;
  case CallRefId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitCallRef
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,(CallRef *)curr);
    break;
  case RefTestId:
    ExpressionRunner<wasm::ModuleRunner>::visitRefTest
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(RefTest *)curr);
    break;
  case RefCastId:
    ExpressionRunner<wasm::ModuleRunner>::visitRefCast
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(RefCast *)curr);
    break;
  case BrOnId:
    ExpressionRunner<wasm::ModuleRunner>::visitBrOn
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(BrOn *)curr);
    break;
  case StructNewId:
    ExpressionRunner<wasm::ModuleRunner>::visitStructNew
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(StructNew *)curr
              );
    break;
  case StructGetId:
    ExpressionRunner<wasm::ModuleRunner>::visitStructGet
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(StructGet *)curr
              );
    break;
  case StructSetId:
    ExpressionRunner<wasm::ModuleRunner>::visitStructSet
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(StructSet *)curr
              );
    break;
  case StructRMWId:
    ExpressionRunner<wasm::ModuleRunner>::visitStructRMW
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(StructRMW *)curr
              );
    break;
  case StructCmpxchgId:
    ExpressionRunner<wasm::ModuleRunner>::visitStructCmpxchg
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,
               (StructCmpxchg *)curr);
    break;
  case ArrayNewId:
    ExpressionRunner<wasm::ModuleRunner>::visitArrayNew
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(ArrayNew *)curr)
    ;
    break;
  case ArrayNewDataId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitArrayNewData
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,
               (ArrayNewData *)curr);
    break;
  case ArrayNewElemId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitArrayNewElem
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,
               (ArrayNewElem *)curr);
    break;
  case ArrayNewFixedId:
    ExpressionRunner<wasm::ModuleRunner>::visitArrayNewFixed
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,
               (ArrayNewFixed *)curr);
    break;
  case ArrayGetId:
    ExpressionRunner<wasm::ModuleRunner>::visitArrayGet
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(ArrayGet *)curr)
    ;
    break;
  case ArraySetId:
    ExpressionRunner<wasm::ModuleRunner>::visitArraySet
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(ArraySet *)curr)
    ;
    break;
  case ArrayLenId:
    ExpressionRunner<wasm::ModuleRunner>::visitArrayLen
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(ArrayLen *)curr)
    ;
    break;
  case ArrayCopyId:
    ExpressionRunner<wasm::ModuleRunner>::visitArrayCopy
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(ArrayCopy *)curr
              );
    break;
  case ArrayFillId:
    ExpressionRunner<wasm::ModuleRunner>::visitArrayFill
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(ArrayFill *)curr
              );
    break;
  case ArrayInitDataId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitArrayInitData
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,
               (ArrayInitData *)curr);
    break;
  case ArrayInitElemId:
    ModuleRunnerBase<wasm::ModuleRunner>::visitArrayInitElem
              (__return_storage_ptr__,(ModuleRunnerBase<wasm::ModuleRunner> *)this,
               (ArrayInitElem *)curr);
    break;
  case RefAsId:
    ExpressionRunner<wasm::ModuleRunner>::visitRefAs
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(RefAs *)curr);
    break;
  case StringNewId:
    ExpressionRunner<wasm::ModuleRunner>::visitStringNew
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(StringNew *)curr
              );
    break;
  case StringConstId:
    ExpressionRunner<wasm::ModuleRunner>::visitStringConst
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,
               (StringConst *)curr);
    break;
  case StringMeasureId:
    ExpressionRunner<wasm::ModuleRunner>::visitStringMeasure
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,
               (StringMeasure *)curr);
    break;
  case StringEncodeId:
    ExpressionRunner<wasm::ModuleRunner>::visitStringEncode
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,
               (StringEncode *)curr);
    break;
  case StringConcatId:
    ExpressionRunner<wasm::ModuleRunner>::visitStringConcat
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,
               (StringConcat *)curr);
    break;
  case StringEqId:
    ExpressionRunner<wasm::ModuleRunner>::visitStringEq
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,(StringEq *)curr)
    ;
    break;
  case StringWTF16GetId:
    ExpressionRunner<wasm::ModuleRunner>::visitStringWTF16Get
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,
               (StringWTF16Get *)curr);
    break;
  case StringSliceWTFId:
    ExpressionRunner<wasm::ModuleRunner>::visitStringSliceWTF
              (__return_storage_ptr__,(ExpressionRunner<wasm::ModuleRunner> *)this,
               (StringSliceWTF *)curr);
    break;
  case ContNewId:
  case ContBindId:
  case SuspendId:
  case ResumeId:
  case ResumeThrowId:
  case StackSwitchId:
    *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                      _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00129b4e:
    *(undefined4 *)&(__return_storage_ptr__->breakTo).super_IString.str._M_len = uVar1;
    *(undefined4 *)((long)&(__return_storage_ptr__->breakTo).super_IString.str._M_len + 4) = uVar2;
    *(undefined4 *)&(__return_storage_ptr__->breakTo).super_IString.str._M_str = uVar3;
    *(undefined4 *)((long)&(__return_storage_ptr__->breakTo).super_IString.str._M_str + 4) = uVar4;
    break;
  default:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
               ,0x46);
  }
  return __return_storage_ptr__;
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }